

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISkin::draw3DTabBody
          (CGUISkin *this,IGUIElement *element,bool border,bool background,rect<int> *rect,
          rect<int> *clip,s32 tabHeight)

{
  IVideoDriver *pIVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  int *piVar7;
  int iVar8;
  rect<int> tr;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  uint local_48;
  undefined4 local_44;
  int *local_40;
  ulong local_38;
  
  if (this->Driver != (IVideoDriver *)0x0) {
    uVar6 = (ulong)(uint)tabHeight;
    local_58 = (rect->UpperLeftCorner).X;
    iStack_54 = (rect->UpperLeftCorner).Y;
    iStack_50 = (rect->LowerRightCorner).X;
    iStack_4c = (rect->LowerRightCorner).Y;
    if (tabHeight == -1) {
      iVar2 = (*(this->super_IGUISkin)._vptr_IGUISkin[2])(this,7);
      uVar6 = CONCAT44(extraout_var,iVar2);
    }
    if (border) {
      local_44 = (undefined4)CONCAT71(in_register_00000009,background);
      local_38 = uVar6;
      if (tr.UpperLeftCorner.X == 0) {
        local_40 = &iStack_4c;
        piVar7 = &iStack_54;
        iStack_54 = iStack_54 + (int)uVar6 + 2;
        iStack_50 = local_58 + 1;
        pIVar1 = this->Driver;
        uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
        (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar3,&local_58,clip);
        iStack_50 = (rect->LowerRightCorner).X;
        local_48 = 1;
        iVar2 = -1;
      }
      else {
        local_40 = &iStack_54;
        piVar7 = &iStack_4c;
        iStack_4c = (iStack_4c - (int)uVar6) + -2;
        iStack_50 = local_58 + 1;
        pIVar1 = this->Driver;
        local_48 = 3;
        uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
        (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar3,&local_58,clip);
        iStack_50 = (rect->LowerRightCorner).X;
        iVar2 = 1;
      }
      local_58 = iStack_50 + -1;
      pIVar1 = this->Driver;
      uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar3,&local_58,clip);
      local_58 = (rect->UpperLeftCorner).X;
      iStack_54 = (rect->UpperLeftCorner).Y;
      iStack_50 = (rect->LowerRightCorner).X;
      iStack_4c = (rect->LowerRightCorner).Y;
      *piVar7 = iVar2 + *local_40;
      pIVar1 = this->Driver;
      uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,(ulong)local_48);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar3,&local_58,clip);
      background = SUB41(local_44,0);
      uVar6 = local_38;
    }
    if (background != false) {
      local_58 = (rect->UpperLeftCorner).X;
      iStack_54 = (rect->UpperLeftCorner).Y;
      iStack_50 = (rect->LowerRightCorner).X;
      iStack_4c = (rect->LowerRightCorner).Y;
      if (tr.UpperLeftCorner.X == 0) {
        iVar4 = (int)uVar6 + 2;
        iVar2 = (int)DAT_00239980;
        iVar8 = DAT_00239980._8_4_;
        iStack_4c = DAT_00239980._12_4_ + iStack_4c;
      }
      else {
        iVar2 = 1;
        iVar4 = -1;
        iVar8 = -1;
        iStack_4c = (iStack_4c - (int)uVar6) + -2;
      }
      iStack_50 = iStack_50 + iVar8;
      iStack_54 = iStack_54 + iVar4;
      local_58 = local_58 + iVar2;
      if (this->UseGradient == false) {
        pIVar1 = this->Driver;
        uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar3,&local_58,clip);
      }
      else {
        uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        uVar5 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
        (*this->Driver->_vptr_IVideoDriver[0x34])
                  (this->Driver,&local_58,(ulong)uVar3,(ulong)uVar3,(ulong)uVar5,(ulong)uVar5,clip);
      }
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DTabBody(IGUIElement *element, bool border, bool background,
		const core::rect<s32> &rect, const core::rect<s32> *clip, s32 tabHeight, EGUI_ALIGNMENT alignment)
{
	if (!Driver)
		return;

	core::rect<s32> tr = rect;

	if (tabHeight == -1)
		tabHeight = getSize(gui::EGDS_BUTTON_HEIGHT);

	// draw border.
	if (border) {
		if (alignment == EGUIA_UPPERLEFT) {
			// draw left hightlight
			tr.UpperLeftCorner.Y += tabHeight + 2;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);

			// draw right shadow
			tr.UpperLeftCorner.X = rect.LowerRightCorner.X - 1;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);

			// draw lower shadow
			tr = rect;
			tr.UpperLeftCorner.Y = tr.LowerRightCorner.Y - 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);
		} else {
			// draw left hightlight
			tr.LowerRightCorner.Y -= tabHeight + 2;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);

			// draw right shadow
			tr.UpperLeftCorner.X = rect.LowerRightCorner.X - 1;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);

			// draw lower shadow
			tr = rect;
			tr.LowerRightCorner.Y = tr.UpperLeftCorner.Y + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);
		}
	}

	if (background) {
		if (alignment == EGUIA_UPPERLEFT) {
			tr = rect;
			tr.UpperLeftCorner.Y += tabHeight + 2;
			tr.LowerRightCorner.X -= 1;
			tr.UpperLeftCorner.X += 1;
			tr.LowerRightCorner.Y -= 1;
		} else {
			tr = rect;
			tr.UpperLeftCorner.X += 1;
			tr.UpperLeftCorner.Y -= 1;
			tr.LowerRightCorner.X -= 1;
			tr.LowerRightCorner.Y -= tabHeight + 2;
			// tr.UpperLeftCorner.X += 1;
		}

		if (!UseGradient)
			Driver->draw2DRectangle(getColor(EGDC_3D_FACE), tr, clip);
		else {
			video::SColor c1 = getColor(EGDC_3D_FACE);
			video::SColor c2 = getColor(EGDC_3D_SHADOW);
			Driver->draw2DRectangle(tr, c1, c1, c2, c2, clip);
		}
	}
}